

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

Gia_Man_t * Gia_ManFromMiniAig(Mini_Aig_t *p,Vec_Int_t **pvCopies)

{
  int iVar1;
  int iVar2;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar3;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar4;
  int local_38;
  int nNodes;
  int iGiaLit;
  int i;
  Vec_Int_t *vCopies;
  Gia_Man_t *pTemp;
  Gia_Man_t *pGia;
  Vec_Int_t **pvCopies_local;
  Mini_Aig_t *p_local;
  
  iVar1 = Mini_AigNodeNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav("MiniAig");
  p_00->pName = pcVar3;
  p_01 = Vec_IntAlloc(iVar1);
  Vec_IntPush(p_01,0);
  Gia_ManHashAlloc(p_00);
  nNodes = 1;
  do {
    if (iVar1 <= nNodes) {
      Gia_ManHashStop(p_00);
      iVar2 = Vec_IntSize(p_01);
      if (iVar2 != iVar1) {
        __assert_fail("Vec_IntSize(vCopies) == nNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                      ,0x57,"Gia_Man_t *Gia_ManFromMiniAig(Mini_Aig_t *, Vec_Int_t **)");
      }
      if (pvCopies == (Vec_Int_t **)0x0) {
        Vec_IntFree(p_01);
      }
      else {
        *pvCopies = p_01;
      }
      iVar1 = Mini_AigRegNum(p);
      Gia_ManSetRegNum(p_00,iVar1);
      pGVar4 = Gia_ManCleanup(p_00);
      if (pvCopies != (Vec_Int_t **)0x0) {
        Gia_ManDupRemapLiterals(*pvCopies,p_00);
      }
      Gia_ManStop(p_00);
      return pGVar4;
    }
    iVar2 = Mini_AigNodeIsPi(p,nNodes);
    if (iVar2 == 0) {
      iVar2 = Mini_AigNodeIsPo(p,nNodes);
      if (iVar2 == 0) {
        iVar2 = Mini_AigNodeIsAnd(p,nNodes);
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                        ,0x53,"Gia_Man_t *Gia_ManFromMiniAig(Mini_Aig_t *, Vec_Int_t **)");
        }
        iVar2 = Gia_ObjFromMiniFanin0Copy(p_00,p_01,p,nNodes);
        iLit1 = Gia_ObjFromMiniFanin1Copy(p_00,p_01,p,nNodes);
        local_38 = Gia_ManHashAnd(p_00,iVar2,iLit1);
      }
      else {
        iVar2 = Gia_ObjFromMiniFanin0Copy(p_00,p_01,p,nNodes);
        local_38 = Gia_ManAppendCo(p_00,iVar2);
      }
    }
    else {
      local_38 = Gia_ManAppendCi(p_00);
    }
    Vec_IntPush(p_01,local_38);
    nNodes = nNodes + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManFromMiniAig( Mini_Aig_t * p, Vec_Int_t ** pvCopies )
{
    Gia_Man_t * pGia, * pTemp;
    Vec_Int_t * vCopies;
    int i, iGiaLit = 0, nNodes;
    // get the number of nodes
    nNodes = Mini_AigNodeNum(p);
    // create ABC network
    pGia = Gia_ManStart( nNodes );
    pGia->pName = Abc_UtilStrsav( "MiniAig" );
    // create mapping from MiniAIG objects into ABC objects
    vCopies = Vec_IntAlloc( nNodes );
    Vec_IntPush( vCopies, 0 );
    // iterate through the objects
    Gia_ManHashAlloc( pGia );
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
            iGiaLit = Gia_ManAppendCi(pGia);
        else if ( Mini_AigNodeIsPo( p, i ) )
            iGiaLit = Gia_ManAppendCo(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i));
        else if ( Mini_AigNodeIsAnd( p, i ) )
            iGiaLit = Gia_ManHashAnd(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i), Gia_ObjFromMiniFanin1Copy(pGia, vCopies, p, i));
        else assert( 0 );
        Vec_IntPush( vCopies, iGiaLit );
    }
    Gia_ManHashStop( pGia );
    assert( Vec_IntSize(vCopies) == nNodes );
    if ( pvCopies )
        *pvCopies = vCopies;
    else
        Vec_IntFree( vCopies );
    Gia_ManSetRegNum( pGia, Mini_AigRegNum(p) );
    pGia = Gia_ManCleanup( pTemp = pGia );
    if ( pvCopies )
        Gia_ManDupRemapLiterals( *pvCopies, pTemp );
    Gia_ManStop( pTemp );
    return pGia;
}